

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

int64_t av1_lowbd_pixel_proj_error_sse4_1
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int in_ECX;
  int in_EDX;
  long lVar29;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  ulong extraout_XMM0_Qb_07;
  ulong extraout_XMM0_Qb_08;
  undefined1 auVar30 [16];
  __m128i alVar31;
  long in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  int in_stack_00000020;
  int *in_stack_00000028;
  int *in_stack_00000030;
  int64_t sum [2];
  __m128i sum64_1_2;
  __m128i sum64_0_2;
  int32_t e_2;
  __m128i err1;
  __m128i err0_2;
  __m128i diff1;
  __m128i diff0;
  __m128i s1;
  __m128i s0_2;
  __m128i d1;
  __m128i d0_2;
  __m128i s;
  __m128i d;
  __m128i sum32_2;
  __m128i sum64_1_1;
  __m128i sum64_0_1;
  int32_t e_1;
  int32_t v_1;
  int32_t u_1;
  __m128i err0_1;
  __m128i e0_1;
  __m128i vr1_1;
  __m128i vr0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i flt_16b;
  __m128i s0_1;
  __m128i d0_1;
  __m128i sum32_1;
  int flt_stride;
  int32_t *flt;
  __m128i xq_coeff_1;
  int xq_active;
  __m128i sum64_1;
  __m128i sum64_0;
  int32_t e;
  int32_t v;
  int32_t u;
  __m128i err0;
  __m128i e0;
  __m128i vr1;
  __m128i vr0;
  __m128i v1;
  __m128i v0;
  __m128i flt1_0_sub_u;
  __m128i flt0_0_sub_u;
  __m128i u0;
  __m128i flt1_16b;
  __m128i flt0_16b;
  __m128i s0;
  __m128i d0;
  __m128i sum32;
  __m128i xq_coeff;
  int64_t err;
  uint8_t *dat;
  uint8_t *src;
  __m128i sum64;
  __m128i rounding;
  int32_t shift;
  int k;
  int j;
  int i;
  int local_a6c;
  long local_a68;
  int local_a5c;
  long local_a38;
  long local_a30;
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  int local_9fc;
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  short local_9d8;
  short sStack_9d6;
  short sStack_9d4;
  short sStack_9d2;
  short sStack_9d0;
  short sStack_9ce;
  short sStack_9cc;
  short sStack_9ca;
  short local_9c8;
  short sStack_9c6;
  short sStack_9c4;
  short sStack_9c2;
  short sStack_9c0;
  short sStack_9be;
  short sStack_9bc;
  short sStack_9ba;
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined8 local_968;
  ulong uStack_960;
  int local_958;
  int iStack_954;
  int iStack_950;
  int iStack_94c;
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  int local_924;
  int local_920;
  int local_91c;
  undefined1 local_918 [16];
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  short sStack_8fa;
  int local_8f8;
  int iStack_8f4;
  int iStack_8f0;
  int iStack_8ec;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_87c;
  int local_874;
  long local_870;
  undefined8 local_868;
  undefined8 uStack_860;
  int local_84c;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  int local_824;
  int local_820;
  int local_81c;
  undefined1 local_818 [16];
  short local_808;
  short sStack_806;
  short sStack_804;
  short sStack_802;
  short sStack_800;
  short sStack_7fe;
  short sStack_7fc;
  short sStack_7fa;
  int local_7f8;
  int iStack_7f4;
  int iStack_7f0;
  int iStack_7ec;
  int local_7e8;
  int iStack_7e4;
  int iStack_7e0;
  int iStack_7dc;
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [16];
  short local_7b8;
  short sStack_7b6;
  short sStack_7b4;
  short sStack_7b2;
  short sStack_7b0;
  short sStack_7ae;
  short sStack_7ac;
  short sStack_7aa;
  short local_7a8;
  short sStack_7a6;
  short sStack_7a4;
  short sStack_7a2;
  short sStack_7a0;
  short sStack_79e;
  short sStack_79c;
  short sStack_79a;
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  undefined1 local_778 [16];
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  int local_748;
  int iStack_744;
  int iStack_740;
  int iStack_73c;
  undefined8 local_738;
  undefined8 uStack_730;
  long local_720;
  long local_718;
  long local_710;
  long local_708;
  long lStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined4 local_6e4;
  int local_6e0;
  int local_6dc;
  int local_6d8;
  int local_6d4;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  undefined4 local_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined1 local_668 [16];
  undefined1 local_648 [16];
  undefined8 local_628;
  undefined8 local_618;
  undefined8 local_608;
  undefined8 local_5f8;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined4 local_53c;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  short local_4d8;
  short sStack_4d6;
  short sStack_4d4;
  short sStack_4d2;
  short sStack_4d0;
  short sStack_4ce;
  short sStack_4cc;
  short sStack_4ca;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  short local_4b8;
  short sStack_4b6;
  short sStack_4b4;
  short sStack_4b2;
  short sStack_4b0;
  short sStack_4ae;
  short sStack_4ac;
  short sStack_4aa;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined2 local_408;
  short sStack_406;
  undefined2 uStack_404;
  short sStack_402;
  undefined2 uStack_400;
  short sStack_3fe;
  undefined2 uStack_3fc;
  short sStack_3fa;
  undefined2 local_3e8;
  short sStack_3e6;
  undefined2 uStack_3e4;
  short sStack_3e2;
  undefined2 uStack_3e0;
  short sStack_3de;
  undefined2 uStack_3dc;
  short sStack_3da;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  short local_3a8;
  short sStack_3a6;
  short sStack_3a4;
  short sStack_3a2;
  short sStack_3a0;
  short sStack_39e;
  short sStack_39c;
  short sStack_39a;
  short local_388;
  short sStack_386;
  short sStack_384;
  short sStack_382;
  short sStack_380;
  short sStack_37e;
  short sStack_37c;
  short sStack_37a;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined4 local_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  undefined4 local_2bc;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  undefined4 local_29c;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  undefined4 local_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  long local_c8;
  long lStack_c0;
  long local_b8;
  long lStack_b0;
  long local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  long local_38;
  long lStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_6bc = (int)in_RSI;
  local_6e4 = 0xb;
  local_6ac = 0x400;
  local_4 = 0x400;
  local_8 = 0x400;
  local_c = 0x400;
  local_10 = 0x400;
  lVar29 = 0x400;
  local_6f8 = 0x40000000400;
  uStack_6f0 = 0x40000000400;
  local_678 = 0;
  uStack_670 = 0;
  local_708 = 0;
  lStack_700 = 0;
  local_720 = 0;
  local_718 = in_R8;
  local_710 = in_RDI;
  local_6d4 = in_R9D;
  local_6c4 = in_ECX;
  local_6c0 = in_EDX;
  local_28 = local_6f8;
  uStack_20 = uStack_6f0;
  if ((*in_stack_00000030 < 1) || (in_stack_00000030[1] < 1)) {
    if ((*in_stack_00000030 < 1) && (in_stack_00000030[1] < 1)) {
      local_6a8 = 0;
      uStack_6a0 = 0;
      local_958 = 0;
      iStack_954 = 0;
      iStack_950 = 0;
      iStack_94c = 0;
      for (local_6d8 = 0; local_6d8 < local_6c0; local_6d8 = local_6d8 + 1) {
        for (local_6dc = 0; local_6dc <= local_6bc + -0x10; local_6dc = local_6dc + 0x10) {
          xx_loadu_128((void *)(local_718 + local_6dc));
          local_968 = extraout_XMM0_Qa_07;
          uStack_960 = extraout_XMM0_Qb_07;
          alVar31 = xx_loadu_128((void *)(local_710 + local_6dc));
          lVar29 = alVar31[1];
          auVar3._8_8_ = uStack_960;
          auVar3._0_8_ = local_968;
          local_988 = pmovzxbw(auVar3,local_968);
          local_648._8_8_ = 0;
          local_648._0_8_ = uStack_960;
          local_998 = pmovzxbw(local_648,uStack_960);
          auVar2._8_8_ = extraout_XMM0_Qb_08;
          auVar2._0_8_ = extraout_XMM0_Qa_08;
          local_9a8 = pmovzxbw(auVar2,extraout_XMM0_Qa_08);
          local_668._8_8_ = 0;
          local_668._0_8_ = extraout_XMM0_Qb_08;
          local_9b8 = pmovzxbw(local_668,extraout_XMM0_Qb_08);
          local_4f8._0_2_ = local_988._0_2_;
          local_4f8._2_2_ = local_988._2_2_;
          local_4f8._4_2_ = local_988._4_2_;
          local_4f8._6_2_ = local_988._6_2_;
          uStack_4f0._0_2_ = local_988._8_2_;
          uStack_4f0._2_2_ = local_988._10_2_;
          uStack_4f0._4_2_ = local_988._12_2_;
          uStack_4f0._6_2_ = local_988._14_2_;
          local_508._0_2_ = local_9a8._0_2_;
          local_508._2_2_ = local_9a8._2_2_;
          local_508._4_2_ = local_9a8._4_2_;
          local_508._6_2_ = local_9a8._6_2_;
          uStack_500._0_2_ = local_9a8._8_2_;
          uStack_500._2_2_ = local_9a8._10_2_;
          uStack_500._4_2_ = local_9a8._12_2_;
          uStack_500._6_2_ = local_9a8._14_2_;
          local_9c8 = (short)local_4f8 - (short)local_508;
          sStack_9c6 = local_4f8._2_2_ - local_508._2_2_;
          sStack_9c4 = local_4f8._4_2_ - local_508._4_2_;
          sStack_9c2 = local_4f8._6_2_ - local_508._6_2_;
          sStack_9c0 = (short)uStack_4f0 - (short)uStack_500;
          sStack_9be = uStack_4f0._2_2_ - uStack_500._2_2_;
          sStack_9bc = uStack_4f0._4_2_ - uStack_500._4_2_;
          sStack_9ba = uStack_4f0._6_2_ - uStack_500._6_2_;
          local_518._0_2_ = local_998._0_2_;
          local_518._2_2_ = local_998._2_2_;
          local_518._4_2_ = local_998._4_2_;
          local_518._6_2_ = local_998._6_2_;
          uStack_510._0_2_ = local_998._8_2_;
          uStack_510._2_2_ = local_998._10_2_;
          uStack_510._4_2_ = local_998._12_2_;
          uStack_510._6_2_ = local_998._14_2_;
          local_528._0_2_ = local_9b8._0_2_;
          local_528._2_2_ = local_9b8._2_2_;
          local_528._4_2_ = local_9b8._4_2_;
          local_528._6_2_ = local_9b8._6_2_;
          uStack_520._0_2_ = local_9b8._8_2_;
          uStack_520._2_2_ = local_9b8._10_2_;
          uStack_520._4_2_ = local_9b8._12_2_;
          uStack_520._6_2_ = local_9b8._14_2_;
          local_9d8 = (short)local_518 - (short)local_528;
          sStack_9d6 = local_518._2_2_ - local_528._2_2_;
          sStack_9d4 = local_518._4_2_ - local_528._4_2_;
          sStack_9d2 = local_518._6_2_ - local_528._6_2_;
          sStack_9d0 = (short)uStack_510 - (short)uStack_520;
          sStack_9ce = uStack_510._2_2_ - uStack_520._2_2_;
          sStack_9cc = uStack_510._4_2_ - uStack_520._4_2_;
          sStack_9ca = uStack_510._6_2_ - uStack_520._6_2_;
          local_438 = CONCAT26(sStack_9c2,CONCAT24(sStack_9c4,CONCAT22(sStack_9c6,local_9c8)));
          uStack_430 = CONCAT26(sStack_9ba,CONCAT24(sStack_9bc,CONCAT22(sStack_9be,sStack_9c0)));
          local_448 = CONCAT26(sStack_9c2,CONCAT24(sStack_9c4,CONCAT22(sStack_9c6,local_9c8)));
          uStack_440 = CONCAT26(sStack_9ba,CONCAT24(sStack_9bc,CONCAT22(sStack_9be,sStack_9c0)));
          auVar16._8_8_ = uStack_430;
          auVar16._0_8_ = local_438;
          auVar15._8_8_ = uStack_440;
          auVar15._0_8_ = local_448;
          local_9e8 = pmaddwd(auVar16,auVar15);
          local_458 = CONCAT26(sStack_9d2,CONCAT24(sStack_9d4,CONCAT22(sStack_9d6,local_9d8)));
          uStack_450 = CONCAT26(sStack_9ca,CONCAT24(sStack_9cc,CONCAT22(sStack_9ce,sStack_9d0)));
          local_468 = CONCAT26(sStack_9d2,CONCAT24(sStack_9d4,CONCAT22(sStack_9d6,local_9d8)));
          uStack_460 = CONCAT26(sStack_9ca,CONCAT24(sStack_9cc,CONCAT22(sStack_9ce,sStack_9d0)));
          auVar14._8_8_ = uStack_450;
          auVar14._0_8_ = local_458;
          auVar13._8_8_ = uStack_460;
          auVar13._0_8_ = local_468;
          local_9f8 = pmaddwd(auVar14,auVar13);
          local_238 = CONCAT44(iStack_954,local_958);
          uStack_230 = CONCAT44(iStack_94c,iStack_950);
          local_248._0_4_ = local_9e8._0_4_;
          local_248._4_4_ = local_9e8._4_4_;
          uStack_240._0_4_ = local_9e8._8_4_;
          uStack_240._4_4_ = local_9e8._12_4_;
          local_258 = CONCAT44(iStack_954 + local_248._4_4_,local_958 + (int)local_248);
          uStack_250 = CONCAT44(iStack_94c + uStack_240._4_4_,iStack_950 + (int)uStack_240);
          local_268._0_4_ = local_9f8._0_4_;
          local_268._4_4_ = local_9f8._4_4_;
          uStack_260._0_4_ = local_9f8._8_4_;
          uStack_260._4_4_ = local_9f8._12_4_;
          local_958 = local_958 + (int)local_248 + (int)local_268;
          iStack_954 = iStack_954 + local_248._4_4_ + local_268._4_4_;
          iStack_950 = iStack_950 + (int)uStack_240 + (int)uStack_260;
          iStack_94c = iStack_94c + uStack_240._4_4_ + uStack_260._4_4_;
          local_528 = local_9b8._0_8_;
          uStack_520 = local_9b8._8_8_;
          local_518 = local_998._0_8_;
          uStack_510 = local_998._8_8_;
          local_508 = local_9a8._0_8_;
          uStack_500 = local_9a8._8_8_;
          local_4f8 = local_988._0_8_;
          uStack_4f0 = local_988._8_8_;
          local_268 = local_9f8._0_8_;
          uStack_260 = local_9f8._8_8_;
          local_248 = local_9e8._0_8_;
          uStack_240 = local_9e8._8_8_;
        }
        for (local_6e0 = local_6dc; local_6e0 < local_6bc; local_6e0 = local_6e0 + 1) {
          lVar29 = (long)local_6e0;
          local_9fc = (uint)*(byte *)(local_718 + local_6e0) - (uint)*(byte *)(local_710 + lVar29);
          local_720 = (long)local_9fc * (long)local_9fc + local_720;
        }
        local_718 = local_718 + local_6d4;
        local_710 = local_710 + local_6c4;
      }
      local_118._8_4_ = iStack_950;
      local_118._0_8_ = CONCAT44(iStack_954,local_958);
      local_118._12_4_ = iStack_94c;
      local_a18 = pmovsxdq(local_118,CONCAT44(iStack_954,local_958));
      local_128._8_8_ = 0;
      local_128._0_8_ = CONCAT44(iStack_94c,iStack_950);
      local_a28 = pmovsxdq(local_128,CONCAT44(iStack_94c,iStack_950));
      local_b8 = local_a18._0_8_;
      lStack_b0 = local_a18._8_8_;
      local_c8 = local_a28._0_8_;
      lStack_c0 = local_a28._8_8_;
      local_708 = local_a18._0_8_ + local_a28._0_8_;
      lStack_700 = local_a18._8_8_ + local_a28._8_8_;
    }
    else {
      if (*in_stack_00000030 < 1) {
        local_a5c = in_stack_00000028[1];
      }
      else {
        local_a5c = *in_stack_00000028;
      }
      local_84c = local_a5c;
      in_RSI = (ulong)(uint)(local_a5c * -0x10);
      alVar31 = pair_set_epi16(local_a5c,local_a5c * -0x10);
      lVar29 = alVar31[1];
      if (*in_stack_00000030 < 1) {
        local_a68 = in_stack_00000018;
      }
      else {
        local_a68 = in_stack_00000008;
      }
      local_870 = local_a68;
      if (*in_stack_00000030 < 1) {
        local_a6c = in_stack_00000020;
      }
      else {
        local_a6c = in_stack_00000010;
      }
      local_874 = local_a6c;
      local_868 = extraout_XMM0_Qa_04;
      uStack_860 = extraout_XMM0_Qb_04;
      for (local_6d8 = 0; local_6d8 < local_6c0; local_6d8 = local_6d8 + 1) {
        local_698 = 0;
        uStack_690 = 0;
        local_888 = 0;
        iStack_884 = 0;
        iStack_880 = 0;
        iStack_87c = 0;
        for (local_6dc = 0; local_6dc <= local_6bc + -8; local_6dc = local_6dc + 8) {
          xx_loadl_64((void *)(local_718 + local_6dc));
          local_618 = extraout_XMM0_01._0_8_;
          local_898 = pmovzxbw(extraout_XMM0_01,local_618);
          xx_loadl_64((void *)(local_710 + local_6dc));
          local_628 = extraout_XMM0_02._0_8_;
          local_8a8 = pmovzxbw(extraout_XMM0_02,local_628);
          xx_loadu_128((void *)(local_870 + (long)local_6dc * 4));
          alVar31 = xx_loadu_128((void *)(local_870 + 0x10 + (long)local_6dc * 4));
          lVar29 = alVar31[1];
          auVar6._8_8_ = extraout_XMM0_Qb_05;
          auVar6._0_8_ = extraout_XMM0_Qa_05;
          auVar5._8_8_ = extraout_XMM0_Qb_06;
          auVar5._0_8_ = extraout_XMM0_Qa_06;
          local_8b8 = packssdw(auVar6,auVar5);
          uStack_350 = local_8b8._8_8_;
          uStack_360 = local_898._8_8_;
          local_358._0_2_ = local_8b8._0_2_;
          local_3e8 = (undefined2)local_358;
          local_358._2_2_ = local_8b8._2_2_;
          uStack_3e4 = local_358._2_2_;
          local_358._4_2_ = local_8b8._4_2_;
          uStack_3e0 = local_358._4_2_;
          local_358._6_2_ = local_8b8._6_2_;
          uStack_3dc = local_358._6_2_;
          local_368._0_2_ = local_898._0_2_;
          sStack_3e6 = (short)local_368;
          local_368._2_2_ = local_898._2_2_;
          sStack_3e2 = local_368._2_2_;
          local_368._4_2_ = local_898._4_2_;
          sStack_3de = local_368._4_2_;
          local_368._6_2_ = local_898._6_2_;
          sStack_3da = local_368._6_2_;
          auVar22._8_8_ = uStack_860;
          auVar22._0_8_ = local_868;
          auVar21._2_2_ = (short)local_368;
          auVar21._0_2_ = (undefined2)local_358;
          auVar21._4_2_ = local_358._2_2_;
          auVar21._6_2_ = local_368._2_2_;
          auVar21._8_2_ = local_358._4_2_;
          auVar21._10_2_ = local_368._4_2_;
          auVar21._12_2_ = local_358._6_2_;
          auVar21._14_2_ = local_368._6_2_;
          local_8c8 = pmaddwd(auVar22,auVar21);
          local_318 = local_8b8._0_8_;
          local_328 = local_898._0_8_;
          uStack_310._0_2_ = local_8b8._8_2_;
          local_408 = (undefined2)uStack_310;
          uStack_310._2_2_ = local_8b8._10_2_;
          uStack_404 = uStack_310._2_2_;
          uStack_310._4_2_ = local_8b8._12_2_;
          uStack_400 = uStack_310._4_2_;
          uStack_310._6_2_ = local_8b8._14_2_;
          uStack_3fc = uStack_310._6_2_;
          uStack_320._0_2_ = local_898._8_2_;
          sStack_406 = (short)uStack_320;
          uStack_320._2_2_ = local_898._10_2_;
          sStack_402 = uStack_320._2_2_;
          uStack_320._4_2_ = local_898._12_2_;
          sStack_3fe = uStack_320._4_2_;
          uStack_320._6_2_ = local_898._14_2_;
          sStack_3fa = uStack_320._6_2_;
          auVar20._8_8_ = uStack_860;
          auVar20._0_8_ = local_868;
          auVar19._2_2_ = (short)uStack_320;
          auVar19._0_2_ = (undefined2)uStack_310;
          auVar19._4_2_ = uStack_310._2_2_;
          auVar19._6_2_ = uStack_320._2_2_;
          auVar19._8_2_ = uStack_310._4_2_;
          auVar19._10_2_ = uStack_320._4_2_;
          auVar19._12_2_ = uStack_310._6_2_;
          auVar19._14_2_ = uStack_320._6_2_;
          local_8d8 = pmaddwd(auVar20,auVar19);
          local_1d8._0_4_ = local_8c8._0_4_;
          local_1d8._4_4_ = local_8c8._4_4_;
          uStack_1d0._0_4_ = local_8c8._8_4_;
          uStack_1d0._4_4_ = local_8c8._12_4_;
          local_1e8._0_4_ = (int)local_6f8;
          local_1e8._4_4_ = (int)((ulong)local_6f8 >> 0x20);
          uStack_1e0._0_4_ = (int)uStack_6f0;
          uStack_1e0._4_4_ = (int)((ulong)uStack_6f0 >> 0x20);
          local_2b8 = (int)local_1d8 + (int)local_1e8;
          iStack_2b4 = local_1d8._4_4_ + local_1e8._4_4_;
          iStack_2b0 = (int)uStack_1d0 + (int)uStack_1e0;
          iStack_2ac = uStack_1d0._4_4_ + uStack_1e0._4_4_;
          local_2bc = 0xb;
          auVar30 = ZEXT416(0xb);
          local_8e8 = local_2b8 >> auVar30;
          iStack_8e4 = iStack_2b4 >> auVar30;
          iStack_8e0 = iStack_2b0 >> auVar30;
          iStack_8dc = iStack_2ac >> auVar30;
          local_208 = local_6f8;
          uStack_200 = uStack_6f0;
          local_1f8._0_4_ = local_8d8._0_4_;
          local_1f8._4_4_ = local_8d8._4_4_;
          uStack_1f0._0_4_ = local_8d8._8_4_;
          uStack_1f0._4_4_ = local_8d8._12_4_;
          local_2d8 = (int)local_1f8 + (int)local_1e8;
          iStack_2d4 = local_1f8._4_4_ + local_1e8._4_4_;
          iStack_2d0 = (int)uStack_1f0 + (int)uStack_1e0;
          iStack_2cc = uStack_1f0._4_4_ + uStack_1e0._4_4_;
          local_2dc = 0xb;
          auVar30 = ZEXT416(0xb);
          local_8f8 = local_2d8 >> auVar30;
          iStack_8f4 = iStack_2d4 >> auVar30;
          iStack_8f0 = iStack_2d0 >> auVar30;
          iStack_8ec = iStack_2cc >> auVar30;
          local_5d8 = CONCAT44(iStack_8e4,local_8e8);
          uStack_5d0 = CONCAT44(iStack_8dc,iStack_8e0);
          local_5e8 = CONCAT44(iStack_8f4,local_8f8);
          uStack_5e0 = CONCAT44(iStack_8ec,iStack_8f0);
          auVar4._8_8_ = uStack_5d0;
          auVar4._0_8_ = local_5d8;
          auVar30._8_8_ = uStack_5e0;
          auVar30._0_8_ = local_5e8;
          local_158 = packssdw(auVar4,auVar30);
          local_168 = local_898._0_8_;
          uStack_160 = local_898._8_8_;
          local_4d8 = local_158._0_2_ + (short)local_368;
          sStack_4d6 = local_158._2_2_ + local_368._2_2_;
          sStack_4d4 = local_158._4_2_ + local_368._4_2_;
          sStack_4d2 = local_158._6_2_ + local_368._6_2_;
          sStack_4d0 = local_158._8_2_ + (short)uStack_320;
          sStack_4ce = local_158._10_2_ + uStack_320._2_2_;
          sStack_4cc = local_158._12_2_ + uStack_320._4_2_;
          sStack_4ca = local_158._14_2_ + uStack_320._6_2_;
          local_4e8._0_2_ = local_8a8._0_2_;
          local_4e8._2_2_ = local_8a8._2_2_;
          local_4e8._4_2_ = local_8a8._4_2_;
          local_4e8._6_2_ = local_8a8._6_2_;
          uStack_4e0._0_2_ = local_8a8._8_2_;
          uStack_4e0._2_2_ = local_8a8._10_2_;
          uStack_4e0._4_2_ = local_8a8._12_2_;
          uStack_4e0._6_2_ = local_8a8._14_2_;
          local_908 = local_4d8 - (short)local_4e8;
          sStack_906 = sStack_4d6 - local_4e8._2_2_;
          sStack_904 = sStack_4d4 - local_4e8._4_2_;
          sStack_902 = sStack_4d2 - local_4e8._6_2_;
          sStack_900 = sStack_4d0 - (short)uStack_4e0;
          sStack_8fe = sStack_4ce - uStack_4e0._2_2_;
          sStack_8fc = sStack_4cc - uStack_4e0._4_2_;
          sStack_8fa = sStack_4ca - uStack_4e0._6_2_;
          local_418 = CONCAT26(sStack_902,CONCAT24(sStack_904,CONCAT22(sStack_906,local_908)));
          uStack_410 = CONCAT26(sStack_8fa,CONCAT24(sStack_8fc,CONCAT22(sStack_8fe,sStack_900)));
          local_428 = CONCAT26(sStack_902,CONCAT24(sStack_904,CONCAT22(sStack_906,local_908)));
          uStack_420 = CONCAT26(sStack_8fa,CONCAT24(sStack_8fc,CONCAT22(sStack_8fe,sStack_900)));
          auVar18._8_8_ = uStack_410;
          auVar18._0_8_ = local_418;
          auVar17._8_8_ = uStack_420;
          auVar17._0_8_ = local_428;
          local_918 = pmaddwd(auVar18,auVar17);
          local_218 = CONCAT44(iStack_884,local_888);
          uStack_210 = CONCAT44(iStack_87c,iStack_880);
          local_228._0_4_ = local_918._0_4_;
          local_228._4_4_ = local_918._4_4_;
          uStack_220._0_4_ = local_918._8_4_;
          uStack_220._4_4_ = local_918._12_4_;
          local_888 = local_888 + (int)local_228;
          iStack_884 = iStack_884 + local_228._4_4_;
          iStack_880 = iStack_880 + (int)uStack_220;
          iStack_87c = iStack_87c + uStack_220._4_4_;
          local_4e8 = local_8a8._0_8_;
          uStack_4e0 = local_8a8._8_8_;
          local_368 = local_898._0_8_;
          local_358 = local_8b8._0_8_;
          uStack_320 = local_898._8_8_;
          uStack_310 = local_8b8._8_8_;
          local_228 = local_918._0_8_;
          uStack_220 = local_918._8_8_;
          local_1f8 = local_8d8._0_8_;
          uStack_1f0 = local_8d8._8_8_;
          local_1e8 = local_6f8;
          uStack_1e0 = uStack_6f0;
          local_1d8 = local_8c8._0_8_;
          uStack_1d0 = local_8c8._8_8_;
        }
        for (local_6e0 = local_6dc; local_6e0 < local_6bc; local_6e0 = local_6e0 + 1) {
          local_91c = (uint)*(byte *)(local_718 + local_6e0) * 0x10;
          local_920 = local_84c *
                      (*(int *)(local_870 + (long)local_6e0 * 4) +
                      (uint)*(byte *)(local_718 + local_6e0) * -0x10);
          lVar29 = (long)local_6e0;
          local_924 = ((local_920 + 0x400 >> 0xb) + (uint)*(byte *)(local_718 + local_6e0)) -
                      (uint)*(byte *)(local_710 + lVar29);
          local_720 = (long)local_924 * (long)local_924 + local_720;
        }
        local_718 = local_718 + local_6d4;
        local_710 = local_710 + local_6c4;
        local_870 = local_870 + (long)local_874 * 4;
        local_f8._8_4_ = iStack_880;
        local_f8._0_8_ = CONCAT44(iStack_884,local_888);
        local_f8._12_4_ = iStack_87c;
        local_938 = pmovsxdq(local_f8,CONCAT44(iStack_884,local_888));
        local_108._8_8_ = 0;
        local_108._0_8_ = CONCAT44(iStack_87c,iStack_880);
        local_948 = pmovsxdq(local_108,CONCAT44(iStack_87c,iStack_880));
        local_78 = local_708;
        lStack_70 = lStack_700;
        local_88 = local_938._0_8_;
        lStack_80 = local_938._8_8_;
        local_98 = local_708 + local_938._0_8_;
        lStack_90 = lStack_700 + local_938._8_8_;
        local_a8 = local_948._0_8_;
        lStack_a0 = local_948._8_8_;
        local_708 = local_98 + local_948._0_8_;
        lStack_700 = lStack_90 + local_948._8_8_;
      }
    }
  }
  else {
    in_RSI = (ulong)(uint)in_stack_00000028[1];
    alVar31 = pair_set_epi16(*in_stack_00000028,in_stack_00000028[1]);
    lVar29 = alVar31[1];
    local_738 = extraout_XMM0_Qa;
    uStack_730 = extraout_XMM0_Qb;
    for (local_6d8 = 0; local_6d8 < local_6c0; local_6d8 = local_6d8 + 1) {
      local_688 = 0;
      uStack_680 = 0;
      local_748 = 0;
      iStack_744 = 0;
      iStack_740 = 0;
      iStack_73c = 0;
      for (local_6dc = 0; local_6dc <= local_6bc + -8; local_6dc = local_6dc + 8) {
        xx_loadl_64((void *)(local_718 + local_6dc));
        local_5f8 = extraout_XMM0._0_8_;
        local_758 = pmovzxbw(extraout_XMM0,local_5f8);
        xx_loadl_64((void *)(local_710 + local_6dc));
        local_608 = extraout_XMM0_00._0_8_;
        local_768 = pmovzxbw(extraout_XMM0_00,local_608);
        xx_loadu_128((void *)(in_stack_00000008 + (long)local_6dc * 4));
        xx_loadu_128((void *)(in_stack_00000008 + 0x10 + (long)local_6dc * 4));
        auVar12._8_8_ = extraout_XMM0_Qb_00;
        auVar12._0_8_ = extraout_XMM0_Qa_00;
        auVar11._8_8_ = extraout_XMM0_Qb_01;
        auVar11._0_8_ = extraout_XMM0_Qa_01;
        local_778 = packssdw(auVar12,auVar11);
        xx_loadu_128((void *)(in_stack_00000018 + (long)local_6dc * 4));
        alVar31 = xx_loadu_128((void *)(in_stack_00000018 + 0x10 + (long)local_6dc * 4));
        lVar29 = alVar31[1];
        auVar10._8_8_ = extraout_XMM0_Qb_02;
        auVar10._0_8_ = extraout_XMM0_Qa_02;
        auVar9._8_8_ = extraout_XMM0_Qb_03;
        auVar9._0_8_ = extraout_XMM0_Qa_03;
        local_788 = packssdw(auVar10,auVar9);
        local_538 = local_758._0_8_;
        uStack_530 = local_758._8_8_;
        local_53c = 4;
        local_798 = psllw(local_758,ZEXT416(4));
        local_478._0_2_ = local_778._0_2_;
        local_478._2_2_ = local_778._2_2_;
        local_478._4_2_ = local_778._4_2_;
        local_478._6_2_ = local_778._6_2_;
        uStack_470._0_2_ = local_778._8_2_;
        uStack_470._2_2_ = local_778._10_2_;
        uStack_470._4_2_ = local_778._12_2_;
        uStack_470._6_2_ = local_778._14_2_;
        local_488._0_2_ = local_798._0_2_;
        local_488._2_2_ = local_798._2_2_;
        local_488._4_2_ = local_798._4_2_;
        local_488._6_2_ = local_798._6_2_;
        uStack_480._0_2_ = local_798._8_2_;
        uStack_480._2_2_ = local_798._10_2_;
        uStack_480._4_2_ = local_798._12_2_;
        uStack_480._6_2_ = local_798._14_2_;
        local_7a8 = (short)local_478 - (short)local_488;
        sStack_7a6 = local_478._2_2_ - local_488._2_2_;
        sStack_7a4 = local_478._4_2_ - local_488._4_2_;
        sStack_7a2 = local_478._6_2_ - local_488._6_2_;
        sStack_7a0 = (short)uStack_470 - (short)uStack_480;
        sStack_79e = uStack_470._2_2_ - uStack_480._2_2_;
        sStack_79c = uStack_470._4_2_ - uStack_480._4_2_;
        sStack_79a = uStack_470._6_2_ - uStack_480._6_2_;
        local_4a8 = local_798._0_8_;
        uStack_4a0 = local_798._8_8_;
        local_498._0_2_ = local_788._0_2_;
        local_498._2_2_ = local_788._2_2_;
        local_498._4_2_ = local_788._4_2_;
        local_498._6_2_ = local_788._6_2_;
        uStack_490._0_2_ = local_788._8_2_;
        uStack_490._2_2_ = local_788._10_2_;
        uStack_490._4_2_ = local_788._12_2_;
        uStack_490._6_2_ = local_788._14_2_;
        local_7b8 = (short)local_498 - (short)local_488;
        sStack_7b6 = local_498._2_2_ - local_488._2_2_;
        sStack_7b4 = local_498._4_2_ - local_488._4_2_;
        sStack_7b2 = local_498._6_2_ - local_488._6_2_;
        sStack_7b0 = (short)uStack_490 - (short)uStack_480;
        sStack_7ae = uStack_490._2_2_ - uStack_480._2_2_;
        sStack_7ac = uStack_490._4_2_ - uStack_480._4_2_;
        sStack_7aa = uStack_490._6_2_ - uStack_480._6_2_;
        local_338 = CONCAT26(sStack_7a2,CONCAT24(sStack_7a4,CONCAT22(sStack_7a6,local_7a8)));
        uStack_330 = CONCAT26(sStack_79a,CONCAT24(sStack_79c,CONCAT22(sStack_79e,sStack_7a0)));
        local_348 = CONCAT26(sStack_7b2,CONCAT24(sStack_7b4,CONCAT22(sStack_7b6,local_7b8)));
        uStack_340 = CONCAT26(sStack_7aa,CONCAT24(sStack_7ac,CONCAT22(sStack_7ae,sStack_7b0)));
        auVar28._8_8_ = uStack_730;
        auVar28._0_8_ = local_738;
        auVar27._2_2_ = local_7b8;
        auVar27._0_2_ = local_7a8;
        auVar27._4_2_ = sStack_7a6;
        auVar27._6_2_ = sStack_7b6;
        auVar27._8_2_ = sStack_7a4;
        auVar27._10_2_ = sStack_7b4;
        auVar27._12_2_ = sStack_7a2;
        auVar27._14_2_ = sStack_7b2;
        local_7c8 = pmaddwd(auVar28,auVar27);
        local_2f8 = CONCAT26(sStack_7a2,CONCAT24(sStack_7a4,CONCAT22(sStack_7a6,local_7a8)));
        uStack_2f0 = CONCAT26(sStack_79a,CONCAT24(sStack_79c,CONCAT22(sStack_79e,sStack_7a0)));
        local_308 = CONCAT26(sStack_7b2,CONCAT24(sStack_7b4,CONCAT22(sStack_7b6,local_7b8)));
        uStack_300 = CONCAT26(sStack_7aa,CONCAT24(sStack_7ac,CONCAT22(sStack_7ae,sStack_7b0)));
        auVar26._8_8_ = uStack_730;
        auVar26._0_8_ = local_738;
        auVar25._2_2_ = sStack_7b0;
        auVar25._0_2_ = sStack_7a0;
        auVar25._4_2_ = sStack_79e;
        auVar25._6_2_ = sStack_7ae;
        auVar25._8_2_ = sStack_79c;
        auVar25._10_2_ = sStack_7ac;
        auVar25._12_2_ = sStack_79a;
        auVar25._14_2_ = sStack_7aa;
        local_7d8 = pmaddwd(auVar26,auVar25);
        local_178._0_4_ = local_7c8._0_4_;
        local_178._4_4_ = local_7c8._4_4_;
        uStack_170._0_4_ = local_7c8._8_4_;
        uStack_170._4_4_ = local_7c8._12_4_;
        local_188._0_4_ = (int)local_6f8;
        local_188._4_4_ = (int)((ulong)local_6f8 >> 0x20);
        uStack_180._0_4_ = (int)uStack_6f0;
        uStack_180._4_4_ = (int)((ulong)uStack_6f0 >> 0x20);
        local_278 = (int)local_178 + (int)local_188;
        iStack_274 = local_178._4_4_ + local_188._4_4_;
        iStack_270 = (int)uStack_170 + (int)uStack_180;
        iStack_26c = uStack_170._4_4_ + uStack_180._4_4_;
        local_27c = 0xb;
        auVar30 = ZEXT416(0xb);
        local_7e8 = local_278 >> auVar30;
        iStack_7e4 = iStack_274 >> auVar30;
        iStack_7e0 = iStack_270 >> auVar30;
        iStack_7dc = iStack_26c >> auVar30;
        local_1a8 = local_6f8;
        uStack_1a0 = uStack_6f0;
        local_198._0_4_ = local_7d8._0_4_;
        local_198._4_4_ = local_7d8._4_4_;
        uStack_190._0_4_ = local_7d8._8_4_;
        uStack_190._4_4_ = local_7d8._12_4_;
        local_298 = (int)local_198 + (int)local_188;
        iStack_294 = local_198._4_4_ + local_188._4_4_;
        iStack_290 = (int)uStack_190 + (int)uStack_180;
        iStack_28c = uStack_190._4_4_ + uStack_180._4_4_;
        local_29c = 0xb;
        auVar30 = ZEXT416(0xb);
        local_7f8 = local_298 >> auVar30;
        iStack_7f4 = iStack_294 >> auVar30;
        iStack_7f0 = iStack_290 >> auVar30;
        iStack_7ec = iStack_28c >> auVar30;
        local_598 = CONCAT44(iStack_7e4,local_7e8);
        uStack_590 = CONCAT44(iStack_7dc,iStack_7e0);
        local_5a8 = CONCAT44(iStack_7f4,local_7f8);
        uStack_5a0 = CONCAT44(iStack_7ec,iStack_7f0);
        auVar8._8_8_ = uStack_590;
        auVar8._0_8_ = local_598;
        auVar7._8_8_ = uStack_5a0;
        auVar7._0_8_ = local_5a8;
        local_138 = packssdw(auVar8,auVar7);
        local_148._0_2_ = local_758._0_2_;
        local_148._2_2_ = local_758._2_2_;
        local_148._4_2_ = local_758._4_2_;
        local_148._6_2_ = local_758._6_2_;
        uStack_140._0_2_ = local_758._8_2_;
        uStack_140._2_2_ = local_758._10_2_;
        uStack_140._4_2_ = local_758._12_2_;
        uStack_140._6_2_ = local_758._14_2_;
        local_4b8 = local_138._0_2_ + (short)local_148;
        sStack_4b6 = local_138._2_2_ + local_148._2_2_;
        sStack_4b4 = local_138._4_2_ + local_148._4_2_;
        sStack_4b2 = local_138._6_2_ + local_148._6_2_;
        sStack_4b0 = local_138._8_2_ + (short)uStack_140;
        sStack_4ae = local_138._10_2_ + uStack_140._2_2_;
        sStack_4ac = local_138._12_2_ + uStack_140._4_2_;
        sStack_4aa = local_138._14_2_ + uStack_140._6_2_;
        local_4c8._0_2_ = local_768._0_2_;
        local_4c8._2_2_ = local_768._2_2_;
        local_4c8._4_2_ = local_768._4_2_;
        local_4c8._6_2_ = local_768._6_2_;
        uStack_4c0._0_2_ = local_768._8_2_;
        uStack_4c0._2_2_ = local_768._10_2_;
        uStack_4c0._4_2_ = local_768._12_2_;
        uStack_4c0._6_2_ = local_768._14_2_;
        local_808 = local_4b8 - (short)local_4c8;
        sStack_806 = sStack_4b6 - local_4c8._2_2_;
        sStack_804 = sStack_4b4 - local_4c8._4_2_;
        sStack_802 = sStack_4b2 - local_4c8._6_2_;
        sStack_800 = sStack_4b0 - (short)uStack_4c0;
        sStack_7fe = sStack_4ae - uStack_4c0._2_2_;
        sStack_7fc = sStack_4ac - uStack_4c0._4_2_;
        sStack_7fa = sStack_4aa - uStack_4c0._6_2_;
        local_3b8 = CONCAT26(sStack_802,CONCAT24(sStack_804,CONCAT22(sStack_806,local_808)));
        uStack_3b0 = CONCAT26(sStack_7fa,CONCAT24(sStack_7fc,CONCAT22(sStack_7fe,sStack_800)));
        local_3c8 = CONCAT26(sStack_802,CONCAT24(sStack_804,CONCAT22(sStack_806,local_808)));
        uStack_3c0 = CONCAT26(sStack_7fa,CONCAT24(sStack_7fc,CONCAT22(sStack_7fe,sStack_800)));
        auVar24._8_8_ = uStack_3b0;
        auVar24._0_8_ = local_3b8;
        auVar23._8_8_ = uStack_3c0;
        auVar23._0_8_ = local_3c8;
        local_818 = pmaddwd(auVar24,auVar23);
        local_1b8 = CONCAT44(iStack_744,local_748);
        uStack_1b0 = CONCAT44(iStack_73c,iStack_740);
        local_1c8._0_4_ = local_818._0_4_;
        local_1c8._4_4_ = local_818._4_4_;
        uStack_1c0._0_4_ = local_818._8_4_;
        uStack_1c0._4_4_ = local_818._12_4_;
        local_748 = local_748 + (int)local_1c8;
        iStack_744 = iStack_744 + local_1c8._4_4_;
        iStack_740 = iStack_740 + (int)uStack_1c0;
        iStack_73c = iStack_73c + uStack_1c0._4_4_;
        local_4c8 = local_768._0_8_;
        uStack_4c0 = local_768._8_8_;
        local_498 = local_788._0_8_;
        uStack_490 = local_788._8_8_;
        local_488 = local_798._0_8_;
        uStack_480 = local_798._8_8_;
        local_478 = local_778._0_8_;
        uStack_470 = local_778._8_8_;
        local_3a8 = sStack_7a0;
        sStack_3a6 = sStack_7b0;
        sStack_3a4 = sStack_79e;
        sStack_3a2 = sStack_7ae;
        sStack_3a0 = sStack_79c;
        sStack_39e = sStack_7ac;
        sStack_39c = sStack_79a;
        sStack_39a = sStack_7aa;
        local_388 = local_7a8;
        sStack_386 = local_7b8;
        sStack_384 = sStack_7a6;
        sStack_382 = sStack_7b6;
        sStack_380 = sStack_7a4;
        sStack_37e = sStack_7b4;
        sStack_37c = sStack_7a2;
        sStack_37a = sStack_7b2;
        local_1c8 = local_818._0_8_;
        uStack_1c0 = local_818._8_8_;
        local_198 = local_7d8._0_8_;
        uStack_190 = local_7d8._8_8_;
        local_188 = local_6f8;
        uStack_180 = uStack_6f0;
        local_178 = local_7c8._0_8_;
        uStack_170 = local_7c8._8_8_;
        local_148 = local_758._0_8_;
        uStack_140 = local_758._8_8_;
      }
      for (local_6e0 = local_6dc; local_6e0 < local_6bc; local_6e0 = local_6e0 + 1) {
        uVar1 = (uint)*(byte *)(local_718 + local_6e0);
        local_81c = uVar1 * 0x10;
        in_RSI = (ulong)local_6e0;
        local_820 = *in_stack_00000028 *
                    (*(int *)(in_stack_00000008 + (long)local_6e0 * 4) + uVar1 * -0x10) +
                    in_stack_00000028[1] *
                    (*(int *)(in_stack_00000018 + in_RSI * 4) + uVar1 * -0x10);
        lVar29 = (long)local_6e0;
        local_824 = ((local_820 + 0x400 >> 0xb) + (uint)*(byte *)(local_718 + local_6e0)) -
                    (uint)*(byte *)(local_710 + lVar29);
        local_720 = (long)local_824 * (long)local_824 + local_720;
      }
      local_718 = local_718 + local_6d4;
      local_710 = local_710 + local_6c4;
      in_stack_00000008 = in_stack_00000008 + (long)in_stack_00000010 * 4;
      in_stack_00000018 = in_stack_00000018 + (long)in_stack_00000020 * 4;
      local_d8._8_4_ = iStack_740;
      local_d8._0_8_ = CONCAT44(iStack_744,local_748);
      local_d8._12_4_ = iStack_73c;
      local_838 = pmovsxdq(local_d8,CONCAT44(iStack_744,local_748));
      local_e8._8_8_ = 0;
      local_e8._0_8_ = CONCAT44(iStack_73c,iStack_740);
      local_848 = pmovsxdq(local_e8,CONCAT44(iStack_73c,iStack_740));
      local_38 = local_708;
      lStack_30 = lStack_700;
      local_48 = local_838._0_8_;
      lStack_40 = local_838._8_8_;
      local_58 = local_708 + local_838._0_8_;
      lStack_50 = lStack_700 + local_838._8_8_;
      local_68 = local_848._0_8_;
      lStack_60 = local_848._8_8_;
      local_708 = local_58 + local_848._0_8_;
      lStack_700 = lStack_50 + local_848._8_8_;
    }
  }
  alVar31[1] = lVar29;
  alVar31[0] = in_RSI;
  xx_storeu_128(&local_a38,alVar31);
  return local_a38 + local_a30 + local_720;
}

Assistant:

int64_t av1_lowbd_pixel_proj_error_sse4_1(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int xq[2], const sgr_params_type *params) {
  int i, j, k;
  const int32_t shift = SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS;
  const __m128i rounding = _mm_set1_epi32(1 << (shift - 1));
  __m128i sum64 = _mm_setzero_si128();
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {
    __m128i xq_coeff = pair_set_epi16(xq[0], xq[1]);
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        const __m128i d0 = _mm_cvtepu8_epi16(xx_loadl_64(dat + j));
        const __m128i s0 = _mm_cvtepu8_epi16(xx_loadl_64(src + j));
        const __m128i flt0_16b =
            _mm_packs_epi32(xx_loadu_128(flt0 + j), xx_loadu_128(flt0 + j + 4));
        const __m128i flt1_16b =
            _mm_packs_epi32(xx_loadu_128(flt1 + j), xx_loadu_128(flt1 + j + 4));
        const __m128i u0 = _mm_slli_epi16(d0, SGRPROJ_RST_BITS);
        const __m128i flt0_0_sub_u = _mm_sub_epi16(flt0_16b, u0);
        const __m128i flt1_0_sub_u = _mm_sub_epi16(flt1_16b, u0);
        const __m128i v0 = _mm_madd_epi16(
            xq_coeff, _mm_unpacklo_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m128i v1 = _mm_madd_epi16(
            xq_coeff, _mm_unpackhi_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m128i vr0 = _mm_srai_epi32(_mm_add_epi32(v0, rounding), shift);
        const __m128i vr1 = _mm_srai_epi32(_mm_add_epi32(v1, rounding), shift);
        const __m128i e0 =
            _mm_sub_epi16(_mm_add_epi16(_mm_packs_epi32(vr0, vr1), d0), s0);
        const __m128i err0 = _mm_madd_epi16(e0, e0);
        sum32 = _mm_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq[0] * (flt0[k] - u) + xq[1] * (flt1[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
      const __m128i sum64_0 = _mm_cvtepi32_epi64(sum32);
      const __m128i sum64_1 = _mm_cvtepi32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum64_0);
      sum64 = _mm_add_epi64(sum64, sum64_1);
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {
    const int xq_active = (params->r[0] > 0) ? xq[0] : xq[1];
    const __m128i xq_coeff =
        pair_set_epi16(xq_active, -xq_active * (1 << SGRPROJ_RST_BITS));
    const int32_t *flt = (params->r[0] > 0) ? flt0 : flt1;
    const int flt_stride = (params->r[0] > 0) ? flt0_stride : flt1_stride;
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        const __m128i d0 = _mm_cvtepu8_epi16(xx_loadl_64(dat + j));
        const __m128i s0 = _mm_cvtepu8_epi16(xx_loadl_64(src + j));
        const __m128i flt_16b =
            _mm_packs_epi32(xx_loadu_128(flt + j), xx_loadu_128(flt + j + 4));
        const __m128i v0 =
            _mm_madd_epi16(xq_coeff, _mm_unpacklo_epi16(flt_16b, d0));
        const __m128i v1 =
            _mm_madd_epi16(xq_coeff, _mm_unpackhi_epi16(flt_16b, d0));
        const __m128i vr0 = _mm_srai_epi32(_mm_add_epi32(v0, rounding), shift);
        const __m128i vr1 = _mm_srai_epi32(_mm_add_epi32(v1, rounding), shift);
        const __m128i e0 =
            _mm_sub_epi16(_mm_add_epi16(_mm_packs_epi32(vr0, vr1), d0), s0);
        const __m128i err0 = _mm_madd_epi16(e0, e0);
        sum32 = _mm_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq_active * (flt[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt += flt_stride;
      const __m128i sum64_0 = _mm_cvtepi32_epi64(sum32);
      const __m128i sum64_1 = _mm_cvtepi32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum64_0);
      sum64 = _mm_add_epi64(sum64, sum64_1);
    }
  } else {
    __m128i sum32 = _mm_setzero_si128();
    for (i = 0; i < height; ++i) {
      for (j = 0; j <= width - 16; j += 16) {
        const __m128i d = xx_loadu_128(dat + j);
        const __m128i s = xx_loadu_128(src + j);
        const __m128i d0 = _mm_cvtepu8_epi16(d);
        const __m128i d1 = _mm_cvtepu8_epi16(_mm_srli_si128(d, 8));
        const __m128i s0 = _mm_cvtepu8_epi16(s);
        const __m128i s1 = _mm_cvtepu8_epi16(_mm_srli_si128(s, 8));
        const __m128i diff0 = _mm_sub_epi16(d0, s0);
        const __m128i diff1 = _mm_sub_epi16(d1, s1);
        const __m128i err0 = _mm_madd_epi16(diff0, diff0);
        const __m128i err1 = _mm_madd_epi16(diff1, diff1);
        sum32 = _mm_add_epi32(sum32, err0);
        sum32 = _mm_add_epi32(sum32, err1);
      }
      for (k = j; k < width; ++k) {
        const int32_t e = (int32_t)(dat[k]) - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
    const __m128i sum64_0 = _mm_cvtepi32_epi64(sum32);
    const __m128i sum64_1 = _mm_cvtepi32_epi64(_mm_srli_si128(sum32, 8));
    sum64 = _mm_add_epi64(sum64_0, sum64_1);
  }
  int64_t sum[2];
  xx_storeu_128(sum, sum64);
  err += sum[0] + sum[1];
  return err;
}